

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_ior(jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_ior *out_ior)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  cgltf_float cVar4;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    iVar3 = tokens[(uint)i].size;
    uVar2 = i + 1;
    out_ior->ior = 1.5;
    if (0 < iVar3) {
      do {
        iVar3 = iVar3 + -1;
        if ((tokens[uVar2].type != JSMN_STRING) || (tokens[uVar2].size == 0)) goto LAB_00117712;
        iVar1 = cgltf_json_strcmp(tokens + uVar2,json_chunk,"ior");
        if (iVar1 == 0) {
          cVar4 = cgltf_json_to_float(tokens + (long)(int)uVar2 + 1,json_chunk);
          out_ior->ior = cVar4;
          uVar2 = uVar2 + 2;
        }
        else {
          uVar2 = cgltf_skip_json(tokens,uVar2 + 1);
        }
      } while ((-1 < (int)uVar2) && (iVar3 != 0));
    }
  }
  else {
LAB_00117712:
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static int cgltf_parse_json_ior(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_ior* out_ior)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	int size = tokens[i].size;
	++i;

	// Default values
	out_ior->ior = 1.5f;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens+i, json_chunk, "ior") == 0)
		{
			++i;
			out_ior->ior = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else
		{
			i = cgltf_skip_json(tokens, i+1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}